

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O3

VkResult vmaCreateImage(VmaAllocator allocator,VkImageCreateInfo *pImageCreateInfo,
                       VmaAllocationCreateInfo *pAllocationCreateInfo,VkImage *pImage,
                       VmaAllocation *pAllocation,VmaAllocationInfo *pAllocationInfo)

{
  VkImageTiling VVar1;
  VmaAllocation hAllocation;
  VkResult VVar2;
  VkAllocationCallbacks *pVVar3;
  VmaAllocator this;
  bool prefersDedicatedAllocation;
  bool requiresDedicatedAllocation;
  VkAllocationCallbacks *local_58;
  VmaAllocationInfo *local_50;
  VkMemoryRequirements vkMemReq;
  
  VVar2 = VK_ERROR_INITIALIZATION_FAILED;
  if (((((pImageCreateInfo->extent).width != 0) && ((pImageCreateInfo->extent).height != 0)) &&
      ((pImageCreateInfo->extent).depth != 0)) &&
     ((pImageCreateInfo->mipLevels != 0 && (pImageCreateInfo->arrayLayers != 0)))) {
    *pImage = (VkImage)0x0;
    *pAllocation = (VmaAllocation)0x0;
    local_58 = &allocator->m_AllocationCallbacks;
    pVVar3 = (VkAllocationCallbacks *)0x0;
    if (allocator->m_AllocationCallbacksSpecified != false) {
      pVVar3 = local_58;
    }
    local_50 = pAllocationInfo;
    VVar2 = (*(allocator->m_VulkanFunctions).vkCreateImage)
                      (allocator->m_hDevice,pImageCreateInfo,pVVar3,pImage);
    if (VK_ERROR_OUT_OF_HOST_MEMORY < VVar2) {
      VVar1 = pImageCreateInfo->tiling;
      vkMemReq.size = 0;
      vkMemReq.alignment = 0;
      vkMemReq.memoryTypeBits = 0;
      vkMemReq._20_4_ = 0;
      requiresDedicatedAllocation = false;
      prefersDedicatedAllocation = false;
      VmaAllocator_T::GetImageMemoryRequirements
                (allocator,*pImage,&vkMemReq,&requiresDedicatedAllocation,
                 &prefersDedicatedAllocation);
      this = allocator;
      VVar2 = VmaAllocator_T::AllocateMemory
                        (allocator,&vkMemReq,requiresDedicatedAllocation,prefersDedicatedAllocation,
                         (VkBuffer)0x0,*pImage,pImageCreateInfo->usage,pAllocationCreateInfo,
                         (VVar1 == VK_IMAGE_TILING_OPTIMAL) + VMA_SUBALLOCATION_TYPE_IMAGE_LINEAR,1,
                         pAllocation);
      if (VVar2 < VK_SUCCESS) {
        pVVar3 = (VkAllocationCallbacks *)0x0;
        if (allocator->m_AllocationCallbacksSpecified != false) {
          pVVar3 = local_58;
        }
        (*(allocator->m_VulkanFunctions).vkDestroyImage)(allocator->m_hDevice,*pImage,pVVar3);
        *pImage = (VkImage)0x0;
      }
      else if (((pAllocationCreateInfo->flags & 0x80) == 0) &&
              (this = allocator,
              VVar2 = VmaAllocator_T::BindImageMemory(allocator,*pAllocation,0,*pImage,(void *)0x0),
              VVar2 < VK_SUCCESS)) {
        VmaAllocator_T::FreeMemory(allocator,1,pAllocation);
        *pAllocation = (VmaAllocation)0x0;
        pVVar3 = local_58;
        if (allocator->m_AllocationCallbacksSpecified == false) {
          pVVar3 = (VkAllocationCallbacks *)0x0;
        }
        (*(allocator->m_VulkanFunctions).vkDestroyImage)(allocator->m_hDevice,*pImage,pVVar3);
        *pImage = (VkImage)0x0;
      }
      else {
        hAllocation = *pAllocation;
        hAllocation->m_BufferImageUsage = pImageCreateInfo->usage;
        VVar2 = VK_SUCCESS;
        if (local_50 != (VmaAllocationInfo *)0x0) {
          VmaAllocator_T::GetAllocationInfo(this,hAllocation,local_50);
          VVar2 = VK_SUCCESS;
        }
      }
    }
  }
  return VVar2;
}

Assistant:

VMA_CALL_PRE VkResult VMA_CALL_POST vmaCreateImage(
    VmaAllocator allocator,
    const VkImageCreateInfo* pImageCreateInfo,
    const VmaAllocationCreateInfo* pAllocationCreateInfo,
    VkImage* pImage,
    VmaAllocation* pAllocation,
    VmaAllocationInfo* pAllocationInfo)
{
    VMA_ASSERT(allocator && pImageCreateInfo && pAllocationCreateInfo && pImage && pAllocation);

    if(pImageCreateInfo->extent.width == 0 ||
        pImageCreateInfo->extent.height == 0 ||
        pImageCreateInfo->extent.depth == 0 ||
        pImageCreateInfo->mipLevels == 0 ||
        pImageCreateInfo->arrayLayers == 0)
    {
        return VK_ERROR_INITIALIZATION_FAILED;
    }

    VMA_DEBUG_LOG("vmaCreateImage");

    VMA_DEBUG_GLOBAL_MUTEX_LOCK

    *pImage = VK_NULL_HANDLE;
    *pAllocation = VK_NULL_HANDLE;

    // 1. Create VkImage.
    VkResult res = (*allocator->GetVulkanFunctions().vkCreateImage)(
        allocator->m_hDevice,
        pImageCreateInfo,
        allocator->GetAllocationCallbacks(),
        pImage);
    if(res >= 0)
    {
        VmaSuballocationType suballocType = pImageCreateInfo->tiling == VK_IMAGE_TILING_OPTIMAL ?
            VMA_SUBALLOCATION_TYPE_IMAGE_OPTIMAL :
            VMA_SUBALLOCATION_TYPE_IMAGE_LINEAR;

        // 2. Allocate memory using allocator.
        VkMemoryRequirements vkMemReq = {};
        bool requiresDedicatedAllocation = false;
        bool prefersDedicatedAllocation  = false;
        allocator->GetImageMemoryRequirements(*pImage, vkMemReq,
            requiresDedicatedAllocation, prefersDedicatedAllocation);

        res = allocator->AllocateMemory(
            vkMemReq,
            requiresDedicatedAllocation,
            prefersDedicatedAllocation,
            VK_NULL_HANDLE, // dedicatedBuffer
            *pImage, // dedicatedImage
            pImageCreateInfo->usage, // dedicatedBufferImageUsage
            *pAllocationCreateInfo,
            suballocType,
            1, // allocationCount
            pAllocation);

        if(res >= 0)
        {
            // 3. Bind image with memory.
            if((pAllocationCreateInfo->flags & VMA_ALLOCATION_CREATE_DONT_BIND_BIT) == 0)
            {
                res = allocator->BindImageMemory(*pAllocation, 0, *pImage, VMA_NULL);
            }
            if(res >= 0)
            {
                // All steps succeeded.
                #if VMA_STATS_STRING_ENABLED
                    (*pAllocation)->InitBufferImageUsage(pImageCreateInfo->usage);
                #endif
                if(pAllocationInfo != VMA_NULL)
                {
                    allocator->GetAllocationInfo(*pAllocation, pAllocationInfo);
                }

                return VK_SUCCESS;
            }
            allocator->FreeMemory(
                1, // allocationCount
                pAllocation);
            *pAllocation = VK_NULL_HANDLE;
            (*allocator->GetVulkanFunctions().vkDestroyImage)(allocator->m_hDevice, *pImage, allocator->GetAllocationCallbacks());
            *pImage = VK_NULL_HANDLE;
            return res;
        }
        (*allocator->GetVulkanFunctions().vkDestroyImage)(allocator->m_hDevice, *pImage, allocator->GetAllocationCallbacks());
        *pImage = VK_NULL_HANDLE;
        return res;
    }
    return res;
}